

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall wasm::PassRunner::add(PassRunner *this,string *passName)

{
  pointer pcVar1;
  undefined8 uVar2;
  long *local_50 [2];
  long local_40 [2];
  long *local_30;
  
  uVar2 = ::wasm::PassRegistry::get();
  pcVar1 = (passName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + passName->_M_string_length);
  ::wasm::PassRegistry::createPass(&local_30,uVar2,(string *)local_50);
  (**(code **)(*(long *)this + 0x10))(this,&local_30);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  local_30 = (long *)0x0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void add(std::string passName) {
    doAdd(PassRegistry::get()->createPass(passName));
  }